

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vector.cpp
# Opt level: O1

void __thiscall
sc_core::sc_vector_base::report_empty_bind(sc_vector_base *this,char *kind_,bool dst_empty_)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  bool bVar7;
  stringstream str;
  char *local_1d0;
  char local_1c0 [16];
  stringstream local_1b0 [16];
  long local_1a0 [47];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"target `",8);
  pcVar3 = (this->super_sc_object).m_name._M_dataplus._M_p;
  iVar1 = (int)(ostream *)local_1a0;
  if (pcVar3 == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar2 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar3,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"\' ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"(",1);
  if (kind_ == (char *)0x0) {
    std::ios::clear(iVar1 + (int)*(undefined8 *)(local_1a0[0] + -0x18));
  }
  else {
    sVar2 = strlen(kind_);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,kind_,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,") ",2);
  pcVar3 = "empty destination range given";
  if (dst_empty_) {
    pcVar3 = "empty range given";
  }
  lVar6 = 0x1d;
  if (dst_empty_) {
    lVar6 = 0x11;
  }
  bVar7 = (this->vec_).
          super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->vec_).
          super__Vector_base<sc_core::sc_vector_element_*,_std::allocator<sc_core::sc_vector_element_*>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pcVar5 = "not initialised yet";
  if (bVar7) {
    pcVar5 = pcVar3;
  }
  lVar4 = 0x13;
  if (bVar7) {
    lVar4 = lVar6;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar5,lVar4);
  std::__cxx11::stringbuf::str();
  sc_report_handler::report
            (SC_WARNING,"sc_vector::bind called with empty range",local_1d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/utils/sc_vector.cpp"
             ,0x77);
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void
sc_vector_base::report_empty_bind( const char* kind_, bool dst_empty_ ) const
{
  std::stringstream str;

  str << "target `" << name() << "' "
      << "(" << kind_ << ") ";

  if( !size() ) {
    str << "not initialised yet";
  } else if ( dst_empty_ ) {
    str << "empty range given";
  } else {
    str << "empty destination range given";
  }

  SC_REPORT_WARNING( SC_ID_VECTOR_BIND_EMPTY_, str.str().c_str() );
}